

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::ByteSizeLong
          (TestNestedMessageHasBits_NestedMessage *this)

{
  bool bVar1;
  int iVar2;
  RepeatedField<int> *value;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_00;
  reference value_00;
  size_t sVar3;
  ForeignMessage *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<edition_unittest::ForeignMessage> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestNestedMessageHasBits_NestedMessage *this_;
  TestNestedMessageHasBits_NestedMessage *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  value = _internal_nestedmessage_repeated_int32(this);
  sStack_58 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                        (value,1,&(this->field_0)._impl_.
                                  _nestedmessage_repeated_int32_cached_byte_size_);
  iVar2 = _internal_nestedmessage_repeated_foreignmessage_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  this_00 = _internal_nestedmessage_repeated_foreignmessage(this);
  __end2 = google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::begin(this_00);
  msg = (ForeignMessage *)
        google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::end(this_00);
  while( true ) {
    bVar1 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg);
    if (!bVar1) break;
    value_00 = google::protobuf::internal::
               RepeatedPtrIterator<const_edition_unittest::ForeignMessage>::operator*(&__end2);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<edition_unittest::ForeignMessage>(value_00);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_edition_unittest::ForeignMessage>::
    operator++(&__end2);
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestNestedMessageHasBits_NestedMessage::ByteSizeLong() const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 nestedmessage_repeated_int32 = 1;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_nestedmessage_repeated_int32(), 1,
              this_._impl_._nestedmessage_repeated_int32_cached_byte_size_);
    }
    // repeated .edition_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
    {
      total_size += 1UL * this_._internal_nestedmessage_repeated_foreignmessage_size();
      for (const auto& msg : this_._internal_nestedmessage_repeated_foreignmessage()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}